

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O2

char * __thiscall SimpleConfigLoader::trimString(SimpleConfigLoader *this,char *text)

{
  int iVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  if (text != (char *)0x0) {
    sVar2 = strlen(text);
    lVar4 = (long)((int)sVar2 + -1);
    lVar5 = 0;
    for (lVar7 = 0; lVar7 <= lVar4; lVar7 = lVar7 + 1) {
      iVar1 = isspace((int)text[lVar7]);
      if (iVar1 == 0) break;
      lVar5 = lVar5 + 0x100000000;
    }
    uVar6 = (int)sVar2 - (int)lVar7;
    for (; lVar5 >> 0x20 <= lVar4; lVar4 = lVar4 + -1) {
      iVar1 = isspace((int)text[lVar4]);
      if (iVar1 == 0) break;
      uVar6 = uVar6 - 1;
    }
    if (-1 < (int)(uVar6 - 1)) {
      __dest = malloc((ulong)(uVar6 + 1));
      if (__dest != (void *)0x0) {
        *(undefined1 *)((long)__dest + (ulong)uVar6) = 0;
        pcVar3 = (char *)memcpy(__dest,text + lVar7,(ulong)uVar6);
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char* SimpleConfigLoader::trimString(char* text)
{
	if (text == NULL)
	{
		return NULL;
	}

	int startPos = 0;
	int endPos = strlen(text) - 1;

	// Find the first position without a space
	while (startPos <= endPos && isspace((int)*(text + startPos)))
	{
		startPos++;
	}
	// Find the last position without a space
	while (startPos <= endPos && isspace((int)*(text + endPos)))
	{
		endPos--;
	}

	// We must have a valid string
	int length = endPos - startPos + 1;
	if (length <= 0)
	{
		return NULL;
	}

	// Create the trimmed text
	char* trimmedText = (char*)malloc(length + 1);
	if (trimmedText == NULL)
	{
		return NULL;
	}
	trimmedText[length] = '\0';
	memcpy(trimmedText, text + startPos, length);

	return trimmedText;
}